

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlregexp.c
# Opt level: O1

int xmlAutomataNewCounter(xmlAutomataPtr am,int min,int max)

{
  xmlRegCounter *pxVar1;
  uint uVar2;
  uint uVar3;
  
  uVar3 = 0xffffffff;
  if (am != (xmlAutomataPtr)0x0) {
    uVar2 = xmlRegGetCounter(am);
    if (-1 < (int)uVar2) {
      pxVar1 = am->counters;
      pxVar1[uVar2].min = min;
      pxVar1[uVar2].max = max;
      uVar3 = uVar2;
    }
  }
  return uVar3;
}

Assistant:

int
xmlAutomataNewCounter(xmlAutomataPtr am, int min, int max) {
    int ret;

    if (am == NULL)
	return(-1);

    ret = xmlRegGetCounter(am);
    if (ret < 0)
	return(-1);
    am->counters[ret].min = min;
    am->counters[ret].max = max;
    return(ret);
}